

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Import::~Import(Import *this)

{
  Import *this_local;
  
  ~Import(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~Import() = default;